

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

void do_zz_fp(DisasContext_conflict1 *s,arg_rr_esz *a,undefined1 *fn)

{
  TCGv_ptr ptr;
  undefined1 *in_RCX;
  uintptr_t o;
  
  ptr = get_fpstatus_ptr_aarch64((TCGContext_conflict1 *)a,*(int *)fn == 1);
  tcg_gen_gvec_2_ptr_aarch64
            ((TCGContext_conflict1 *)a,*(int *)(fn + 4) * 0x100 + 0xc10,
             *(int *)(fn + 8) * 0x100 + 0xc10,ptr,(uint32_t)s,(uint32_t)s,0,in_RCX);
  tcg_temp_free_internal_aarch64((TCGContext_conflict1 *)a,(TCGTemp *)(ptr + (long)a));
  return;
}

Assistant:

static void do_zz_fp(DisasContext *s, arg_rr_esz *a, gen_helper_gvec_2_ptr *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned vsz = vec_full_reg_size(s);
    TCGv_ptr status = get_fpstatus_ptr(tcg_ctx, a->esz == MO_16);

    tcg_gen_gvec_2_ptr(tcg_ctx, vec_full_reg_offset(s, a->rd),
                       vec_full_reg_offset(s, a->rn),
                       status, vsz, vsz, 0, fn);
    tcg_temp_free_ptr(tcg_ctx, status);
}